

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

void __thiscall
cfd::core::ScriptWitness::SetWitnessStack(ScriptWitness *this,uint32_t index,ByteData *data)

{
  pointer pBVar1;
  CfdException *this_00;
  allocator local_3d;
  uint32_t index_local;
  undefined1 local_38 [32];
  
  pBVar1 = (this->witness_stack_).
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
           super__Vector_impl_data._M_start;
  index_local = index;
  if ((ulong)index <
      (ulong)(((long)(this->witness_stack_).
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) / 0x18)) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pBVar1 + index),
               &data->data_);
    return;
  }
  local_38._0_8_ = "cfdcore_transaction_common.cpp";
  local_38._8_4_ = 0x32;
  local_38._16_8_ = "SetWitnessStack";
  logger::warn<unsigned_int&>
            ((CfdSourceLocation *)local_38,"WitnessStack[{}] out_of_range.",&index_local);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"vin out_of_range error.",&local_3d);
  CfdException::CfdException(this_00,kCfdOutOfRangeError,(string *)local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ScriptWitness::SetWitnessStack(uint32_t index, const ByteData &data) {
  if (witness_stack_.size() <= index) {
    warn(CFD_LOG_SOURCE, "WitnessStack[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "vin out_of_range error.");
  }
  witness_stack_[index] = data;
}